

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

opj_bool tcd_dc_level_shift_decode(opj_tcd_v2_t *p_tcd)

{
  opj_tcd_tile_v2_t *poVar1;
  opj_tcd_resolution_v2_t *poVar2;
  int iVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  opj_tcd_tilecomp_v2_t *poVar7;
  int iVar8;
  opj_tccp_t *poVar9;
  opj_image_comp_t *poVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  OPJ_INT32 *pOVar18;
  
  poVar1 = p_tcd->tcd_image->tiles;
  poVar7 = poVar1->comps;
  poVar9 = p_tcd->tcp->tccps;
  poVar10 = p_tcd->image->comps;
  for (uVar11 = 0; uVar11 < poVar1->numcomps; uVar11 = uVar11 + 1) {
    bVar5 = (byte)poVar10->prec;
    if (poVar10->sgnd == 0) {
      uVar4 = ~(-1 << (bVar5 & 0x1f));
      uVar6 = 0;
    }
    else {
      iVar3 = 1 << (bVar5 - 1 & 0x1f);
      uVar6 = -iVar3;
      uVar4 = iVar3 - 1;
    }
    poVar2 = poVar7->resolutions;
    uVar15 = poVar10->resno_decoded;
    iVar14 = poVar2[uVar15].x1 - poVar2[uVar15].x0;
    pOVar18 = poVar7->data;
    uVar16 = (ulong)(uint)(poVar7->x1 - (iVar14 + poVar7->x0));
    iVar3 = poVar2[uVar15].y1 - poVar2[uVar15].y0;
    if (poVar9->qmfbid == 1) {
      for (iVar8 = 0; iVar8 != iVar3; iVar8 = iVar8 + 1) {
        lVar12 = uVar16 * -4;
        for (lVar17 = 0; iVar14 != (int)lVar17; lVar17 = lVar17 + 1) {
          uVar13 = poVar9->m_dc_level_shift + pOVar18[lVar17];
          uVar15 = uVar4;
          if ((int)uVar13 < (int)uVar4) {
            uVar15 = uVar13;
          }
          if ((int)uVar13 < (int)uVar6) {
            uVar15 = uVar6;
          }
          pOVar18[lVar17] = uVar15;
          lVar12 = lVar12 + -4;
        }
        pOVar18 = (OPJ_INT32 *)((long)pOVar18 - lVar12);
      }
    }
    else {
      for (iVar8 = 0; iVar8 != iVar3; iVar8 = iVar8 + 1) {
        lVar12 = uVar16 * -4;
        for (lVar17 = 0; iVar14 != (int)lVar17; lVar17 = lVar17 + 1) {
          uVar13 = (int)(long)ROUND((float)pOVar18[lVar17]) + poVar9->m_dc_level_shift;
          uVar15 = uVar13;
          if ((int)uVar4 <= (int)uVar13) {
            uVar15 = uVar4;
          }
          if ((int)uVar13 < (int)uVar6) {
            uVar15 = uVar6;
          }
          pOVar18[lVar17] = uVar15;
          lVar12 = lVar12 + -4;
        }
        pOVar18 = (OPJ_INT32 *)((long)pOVar18 - lVar12);
      }
    }
    poVar10 = poVar10 + 1;
    poVar9 = poVar9 + 1;
    poVar7 = poVar7 + 1;
  }
  return 1;
}

Assistant:

opj_bool tcd_dc_level_shift_decode ( opj_tcd_v2_t *p_tcd )
{
	OPJ_UINT32 compno;
	opj_tcd_tilecomp_v2_t * l_tile_comp = 00;
	opj_tccp_t * l_tccp = 00;
	opj_image_comp_t * l_img_comp = 00;
	opj_tcd_resolution_v2_t* l_res = 00;
	opj_tcp_v2_t * l_tcp = 00;
	opj_tcd_tile_v2_t * l_tile;
	OPJ_UINT32 l_width,l_height,i,j;
	OPJ_INT32 * l_current_ptr;
	OPJ_INT32 l_min, l_max;
	OPJ_UINT32 l_stride;

	l_tile = p_tcd->tcd_image->tiles;
	l_tile_comp = l_tile->comps;
	l_tcp = p_tcd->tcp;
	l_tccp = p_tcd->tcp->tccps;
	l_img_comp = p_tcd->image->comps;

	for (compno = 0; compno < l_tile->numcomps; compno++) {
		l_res = l_tile_comp->resolutions + l_img_comp->resno_decoded;
		l_width = (l_res->x1 - l_res->x0);
		l_height = (l_res->y1 - l_res->y0);
		l_stride = (l_tile_comp->x1 - l_tile_comp->x0) - l_width;

		if (l_img_comp->sgnd) {
			l_min = -(1 << (l_img_comp->prec - 1));
			l_max = (1 << (l_img_comp->prec - 1)) - 1;
		}
		else {
            l_min = 0;
			l_max = (1 << l_img_comp->prec) - 1;
		}

		l_current_ptr = l_tile_comp->data;

		if (l_tccp->qmfbid == 1) {
			for (j=0;j<l_height;++j) {
				for (i = 0; i < l_width; ++i) {
					*l_current_ptr = int_clamp(*l_current_ptr + l_tccp->m_dc_level_shift, l_min, l_max);
					++l_current_ptr;
				}
				l_current_ptr += l_stride;
			}
		}
		else {
			for (j=0;j<l_height;++j) {
				for (i = 0; i < l_width; ++i) {
					OPJ_FLOAT32 l_value = *((OPJ_FLOAT32 *) l_current_ptr);
					*l_current_ptr = int_clamp(lrintf(l_value) + l_tccp->m_dc_level_shift, l_min, l_max); ;
					++l_current_ptr;
				}
				l_current_ptr += l_stride;
			}
		}

		++l_img_comp;
		++l_tccp;
		++l_tile_comp;
	}

	return OPJ_TRUE;
}